

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_catalog_entry.cpp
# Opt level: O1

DataTable * __thiscall duckdb::TableCatalogEntry::GetStorage(TableCatalogEntry *this)

{
  InternalException *this_00;
  string local_40;
  
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,
             "Calling GetStorage on a TableCatalogEntry that is not a DuckTableEntry","");
  InternalException::InternalException(this_00,&local_40);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

DataTable &TableCatalogEntry::GetStorage() {
	throw InternalException("Calling GetStorage on a TableCatalogEntry that is not a DuckTableEntry");
}